

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O3

int KINGetNumBetaCondFails(void *kinmem,long *nbcfails)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINGetNumBetaCondFails","kinsol_mem = NULL illegal.");
  }
  else {
    *nbcfails = *(long *)((long)kinmem + 0xe8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINGetNumBetaCondFails(void *kinmem, long int *nbcfails)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINGetNumBetaCondFails", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;
  *nbcfails = nbcf;

  return(KIN_SUCCESS);
}